

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_vacuum.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalVacuum::Deserialize(LogicalVacuum *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::VacuumInfo_*,_false> _Var1;
  TableCatalogEntry *pTVar2;
  int iVar3;
  LogicalVacuum *this_00;
  pointer pLVar4;
  type pVVar5;
  ClientContext *context;
  Binder *ref;
  pointer pBVar6;
  pointer pBVar7;
  InvalidInputException *this_01;
  _Head_base<0UL,_duckdb::VacuumInfo_*,_false> _Var8;
  shared_ptr<duckdb::Binder,_true> binder;
  _Head_base<0UL,_duckdb::LogicalVacuum_*,_false> local_80;
  undefined1 local_78 [16];
  ClientContext *local_68;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_60;
  
  this_00 = (LogicalVacuum *)operator_new(0xb0);
  LogicalVacuum(this_00);
  local_80._M_head_impl = this_00;
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"info");
  if ((char)iVar3 == '\0') {
    _Var8._M_head_impl = (VacuumInfo *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      _Var8._M_head_impl = (VacuumInfo *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParseInfo::Deserialize((ParseInfo *)&local_60,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      _Var8._M_head_impl = (VacuumInfo *)local_60._M_buckets;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  pLVar4 = unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
           operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                       *)&local_80);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"column_id_map");
  Deserializer::
  Read<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            ((type *)&local_60,deserializer);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(pLVar4->column_id_map)._M_h,&local_60);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_60);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pLVar4 = unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
           operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                       *)&local_80);
  _Var1._M_head_impl =
       (pLVar4->info).super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>
       ._M_t.super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
       super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl;
  (pLVar4->info).super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t
  .super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
  super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl = _Var8._M_head_impl;
  if (_Var1._M_head_impl != (VacuumInfo *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_ParseInfo + 8))();
  }
  pLVar4 = unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
           operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                       *)&local_80);
  pVVar5 = unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>,_true>::operator*
                     (&pLVar4->info);
  if (pVVar5->has_table == true) {
    context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
    Binder::CreateBinder
              ((Binder *)(local_78 + 8),context,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
    ref = shared_ptr<duckdb::Binder,_true>::operator->
                    ((shared_ptr<duckdb::Binder,_true> *)(local_78 + 8));
    unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
              (&pVVar5->ref);
    Binder::Bind((Binder *)local_78,(TableRef *)ref);
    pBVar6 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                         *)local_78);
    local_60._M_buckets = (__buckets_ptr)local_78._0_8_;
    if (pBVar6->type != BASE_TABLE) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_60._M_buckets = &local_60._M_before_begin._M_nxt;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"can only vacuum or analyze base tables","");
      InvalidInputException::InvalidInputException(this_01,(string *)&local_60);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78._0_8_ =
         (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
          )0x0;
    pBVar7 = unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
             ::operator->((unique_ptr<duckdb::BoundBaseTableRef,_std::default_delete<duckdb::BoundBaseTableRef>,_true>
                           *)&local_60);
    pTVar2 = pBVar7->table;
    pLVar4 = unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>::
             operator->((unique_ptr<duckdb::LogicalVacuum,_std::default_delete<duckdb::LogicalVacuum>,_true>
                         *)&local_80);
    (pLVar4->table).ptr = pTVar2;
    if ((_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
        local_60._M_buckets != (BoundTableRef *)0x0) {
      (*(code *)(*local_60._M_buckets)[1]._M_nxt)();
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
        local_78._0_8_ != (BoundTableRef *)0x0) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    if (local_68 != (ClientContext *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
    }
  }
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_80._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalVacuum::Deserialize(Deserializer &deserializer) {
	auto result = unique_ptr<LogicalVacuum>(new LogicalVacuum());

	auto tmp_info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "info");
	deserializer.ReadProperty(201, "column_id_map", result->column_id_map);

	result->info = unique_ptr_cast<ParseInfo, VacuumInfo>(std::move(tmp_info));
	auto &info = *result->info;
	if (info.has_table) {
		// deserialize the 'table'
		auto &context = deserializer.Get<ClientContext &>();
		auto binder = Binder::CreateBinder(context);
		auto bound_table = binder->Bind(*info.ref);
		if (bound_table->type != TableReferenceType::BASE_TABLE) {
			throw InvalidInputException("can only vacuum or analyze base tables");
		}
		auto ref = unique_ptr_cast<BoundTableRef, BoundBaseTableRef>(std::move(bound_table));
		auto &table = ref->table;
		result->SetTable(table);
		// FIXME: we should probably verify that the 'column_id_map' and 'columns' are the same on the bound table after
		// deserialization?
	}
	return std::move(result);
}